

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkGeometryInstanceFlagsKHR
Diligent::InstanceFlagsToVkGeometryInstanceFlags(RAYTRACING_INSTANCE_FLAGS Flags)

{
  RAYTRACING_INSTANCE_FLAGS RVar1;
  string msg;
  uint local_54;
  string local_50;
  
  local_54 = 0;
  while (Flags != RAYTRACING_INSTANCE_NONE) {
    RVar1 = -Flags & Flags;
    Flags = Flags ^ RVar1;
    switch(RVar1) {
    case RAYTRACING_INSTANCE_TRIANGLE_FACING_CULL_DISABLE:
      local_54 = local_54 | 1;
      break;
    case RAYTRACING_INSTANCE_TRIANGLE_FRONT_COUNTERCLOCKWISE:
      local_54 = local_54 | 2;
      break;
    default:
      FormatString<char[22]>(&local_50,(char (*) [22])"unknown instance flag");
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"InstanceFlagsToVkGeometryInstanceFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x707);
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case RAYTRACING_INSTANCE_FORCE_OPAQUE:
      local_54 = local_54 | 4;
      break;
    case RAYTRACING_INSTANCE_FLAG_LAST:
      local_54 = local_54 | 8;
    }
  }
  return local_54;
}

Assistant:

VkGeometryInstanceFlagsKHR InstanceFlagsToVkGeometryInstanceFlags(RAYTRACING_INSTANCE_FLAGS Flags)
{
    static_assert(RAYTRACING_INSTANCE_FLAG_LAST == RAYTRACING_INSTANCE_FORCE_NO_OPAQUE,
                  "Please update the switch below to handle the new ray tracing instance flag");

    VkGeometryInstanceFlagsKHR Result = 0;
    while (Flags != RAYTRACING_INSTANCE_NONE)
    {
        RAYTRACING_INSTANCE_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_INSTANCE_TRIANGLE_FACING_CULL_DISABLE:    Result |= VK_GEOMETRY_INSTANCE_TRIANGLE_FACING_CULL_DISABLE_BIT_KHR;    break;
            case RAYTRACING_INSTANCE_TRIANGLE_FRONT_COUNTERCLOCKWISE: Result |= VK_GEOMETRY_INSTANCE_TRIANGLE_FRONT_COUNTERCLOCKWISE_BIT_KHR; break;
            case RAYTRACING_INSTANCE_FORCE_OPAQUE:                    Result |= VK_GEOMETRY_INSTANCE_FORCE_OPAQUE_BIT_KHR;                    break;
            case RAYTRACING_INSTANCE_FORCE_NO_OPAQUE:                 Result |= VK_GEOMETRY_INSTANCE_FORCE_NO_OPAQUE_BIT_KHR;                 break;
            // clang-format on
            default: UNEXPECTED("unknown instance flag");
        }
    }
    return Result;
}